

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O1

int mbedtls_rsa_pkcs1_decrypt
              (mbedtls_rsa_context *ctx,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng,
              int mode,size_t *olen,uchar *input,uchar *output,size_t output_max_len)

{
  int iVar1;
  
  if (ctx->padding == 1) {
    iVar1 = mbedtls_rsa_rsaes_oaep_decrypt
                      (ctx,f_rng,p_rng,mode,(uchar *)0x0,0,olen,input,output,output_max_len);
    return iVar1;
  }
  if (ctx->padding == 0) {
    iVar1 = mbedtls_rsa_rsaes_pkcs1_v15_decrypt
                      (ctx,f_rng,p_rng,mode,olen,input,output,output_max_len);
    return iVar1;
  }
  return -0x4100;
}

Assistant:

int mbedtls_rsa_pkcs1_decrypt( mbedtls_rsa_context *ctx,
                       int (*f_rng)(void *, unsigned char *, size_t),
                       void *p_rng,
                       int mode, size_t *olen,
                       const unsigned char *input,
                       unsigned char *output,
                       size_t output_max_len)
{
    RSA_VALIDATE_RET( ctx != NULL );
    RSA_VALIDATE_RET( mode == MBEDTLS_RSA_PRIVATE ||
                      mode == MBEDTLS_RSA_PUBLIC );
    RSA_VALIDATE_RET( output_max_len == 0 || output != NULL );
    RSA_VALIDATE_RET( input != NULL );
    RSA_VALIDATE_RET( olen != NULL );

    switch( ctx->padding )
    {
#if defined(MBEDTLS_PKCS1_V15)
        case MBEDTLS_RSA_PKCS_V15:
            return mbedtls_rsa_rsaes_pkcs1_v15_decrypt( ctx, f_rng, p_rng, mode, olen,
                                                input, output, output_max_len );
#endif

#if defined(MBEDTLS_PKCS1_V21)
        case MBEDTLS_RSA_PKCS_V21:
            return mbedtls_rsa_rsaes_oaep_decrypt( ctx, f_rng, p_rng, mode, NULL, 0,
                                           olen, input, output,
                                           output_max_len );
#endif

        default:
            return( MBEDTLS_ERR_RSA_INVALID_PADDING );
    }
}